

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::normal_dist<double>::pdf(normal_dist<double> *this,result_type_conflict2 x)

{
  param_type *in_RDI;
  double in_XMM0_Qa;
  result_type_conflict2 rVar1;
  result_type_conflict2 rVar2;
  result_type_conflict2 rVar3;
  result_type_conflict2 rVar4;
  double dVar5;
  result_type_conflict2 t;
  
  rVar1 = param_type::mu(in_RDI);
  rVar2 = param_type::sigma(in_RDI);
  rVar3 = param_type::sigma(in_RDI);
  rVar4 = param_type::sigma(in_RDI);
  dVar5 = exp(((in_XMM0_Qa - rVar1) * (in_XMM0_Qa - rVar1)) / (rVar3 * -2.0 * rVar4));
  return (0.3989422804014327 / rVar2) * dVar5;
}

Assistant:

pdf(result_type x) const {
      const result_type t{x - P.mu()};
      return math::constants<result_type>::one_over_sqrt_2pi / P.sigma() *
             math::exp(t * t / (-2 * P.sigma() * P.sigma()));
    }